

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O2

void __thiscall sglr::GLContext::deleteTextures(GLContext *this,int numTextures,deUint32 *textures)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0;
  uVar2 = 0;
  if (0 < numTextures) {
    uVar2 = (ulong)(uint)numTextures;
  }
  for (; uVar2 * 4 != lVar1; lVar1 = lVar1 + 4) {
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase(&(this->m_allocatedTextures)._M_t,(key_type_conflict *)((long)textures + lVar1));
  }
  glu::CallLogWrapper::glDeleteTextures(this->m_wrapper,numTextures,textures);
  return;
}

Assistant:

void GLContext::deleteTextures (int numTextures, const deUint32* textures)
{
	for (int i = 0; i < numTextures; i++)
		m_allocatedTextures.erase(textures[i]);
	m_wrapper->glDeleteTextures(numTextures, textures);
}